

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O3

uint32_t mjs::index_value_from_string(wstring_view *str)

{
  size_t sVar1;
  long lVar2;
  uint uVar3;
  uint32_t uVar4;
  
  sVar1 = str->_M_len;
  if (sVar1 - 0xb < 0xfffffffffffffff6) {
    uVar4 = 0xffffffff;
    if (sVar1 == 0) {
      __assert_fail("len",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/string.cpp"
                    ,0x27,"uint32_t mjs::index_value_from_string(const std::wstring_view &)");
    }
  }
  else {
    lVar2 = 0;
    uVar3 = 0;
    do {
      if (9 < (uint)(str->_M_str[lVar2] + L'\xffffffd0')) {
        return 0xffffffff;
      }
      uVar4 = (str->_M_str[lVar2] + uVar3 * 10) - 0x30;
      if (uVar4 < uVar3) {
        return 0xffffffff;
      }
      lVar2 = lVar2 + 1;
      uVar3 = uVar4;
    } while ((uint)lVar2 < (uint)sVar1);
  }
  return uVar4;
}

Assistant:

uint32_t index_value_from_string(const std::wstring_view& str) {
    const auto len = str.length();
    if (len == 0 || len > 10) {
        assert(len); // Shouldn't be passed the empty string
        return invalid_index_value;
    }
    uint32_t index = 0;
    for (uint32_t i = 0; i < len; ++i) {
        const auto ch = str[i];
        if (ch < L'0' || ch > L'9') {
            return invalid_index_value;
        }
        const auto last = index;
        index = index*10 + (ch - L'0');
        if (index < last) {
            // Overflow
            return invalid_index_value;
        }
    }
    return index;
}